

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O2

void __thiscall FMapInfoParser::ParseIntermission(FMapInfoParser *this)

{
  bool bVar1;
  undefined8 in_RAX;
  FIntermissionDescriptor *desc;
  FName local_28;
  FName intname;
  
  intname.Index = (int)((ulong)in_RAX >> 0x20);
  FScanner::MustGetString(&this->sc);
  FName::FName(&intname,(this->sc).String);
  desc = (FIntermissionDescriptor *)operator_new(0x18);
  (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Most = 0;
  (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count = 0;
  *(undefined8 *)desc = 0;
  (desc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array =
       (FIntermissionAction **)0x0;
  _local_28 = CONCAT44(intname.Index,intname.Index);
  ReplaceIntermission(&local_28,desc);
  FScanner::MustGetToken(&this->sc,0x7b);
  while( true ) {
    bVar1 = FScanner::CheckToken(&this->sc,0x7d);
    if (bVar1) break;
    ParseIntermissionAction(this,desc);
  }
  return;
}

Assistant:

void FMapInfoParser::ParseIntermission()
{
	sc.MustGetString();
	FName intname = sc.String;
	FIntermissionDescriptor *desc = new FIntermissionDescriptor();

	ReplaceIntermission(intname, desc);
	sc.MustGetToken('{');
	while (!sc.CheckToken('}'))
	{
		ParseIntermissionAction(desc);
	}
}